

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_vector.h
# Opt level: O2

void __thiscall wasm::SortedVector::insert(SortedVector *this,Index x)

{
  uint *puVar1;
  pointer puVar2;
  pointer puVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var4
  ;
  pointer puVar5;
  size_t __n;
  ulong uVar6;
  uint local_1c [2];
  Index x_local;
  
  local_1c[0] = x;
  _Var4 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,__gnu_cxx::__ops::_Iter_less_val>
                    ((this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (_Var4._M_current == puVar1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,local_1c);
  }
  else if (local_1c[0] < *_Var4._M_current) {
    puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
               ((long)puVar1 - (long)puVar2 >> 2) + 1);
    puVar5 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar6 = (ulong)((long)_Var4._M_current - (long)puVar2) >> 2 & 0xffffffff;
    __n = (long)puVar3 + (-4 - (long)(puVar5 + uVar6));
    if (__n != 0) {
      memmove((void *)((long)puVar3 - __n),puVar5 + uVar6,__n);
      puVar5 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    puVar5[uVar6] = local_1c[0];
  }
  return;
}

Assistant:

void insert(Index x) {
    auto it = std::lower_bound(begin(), end(), x);
    if (it == end()) {
      push_back(x);
    } else if (*it > x) {
      Index i = it - begin();
      resize(size() + 1);
      std::move_backward(begin() + i, begin() + size() - 1, end());
      (*this)[i] = x;
    }
  }